

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack13_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x1fff;
  out[1] = uVar1 >> 0xd & 0x1fff;
  out[2] = uVar1 >> 0x1a;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x1a | (uVar2 & 0x7f) << 6;
  out[3] = uVar2 >> 7 & 0x1fff;
  out[4] = uVar2 >> 0x14;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x14 | (uVar1 & 1) << 0xc;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6010);
  auVar4._8_4_ = 0x1fff;
  auVar4._0_8_ = 0x1fff00001fff;
  auVar4._12_4_ = 0x1fff;
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 5) = auVar3._0_8_;
  uVar2 = in[3];
  out[7] = uVar1 >> 0x1b;
  out[7] = uVar1 >> 0x1b | (uVar2 & 0xff) << 5;
  uVar1 = in[4];
  out[8] = uVar2 >> 8 & 0x1fff;
  out[9] = uVar2 >> 0x15;
  out[9] = uVar2 >> 0x15 | (uVar1 & 3) << 0xb;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6020);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 10) = auVar3._0_8_;
  out[0xc] = uVar1 >> 0x1c;
  uVar2 = in[5];
  out[0xc] = uVar1 >> 0x1c | (uVar2 & 0x1ff) << 4;
  out[0xd] = uVar2 >> 9 & 0x1fff;
  out[0xe] = uVar2 >> 0x16;
  uVar1 = in[6];
  out[0xe] = uVar2 >> 0x16 | (uVar1 & 7) << 10;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6030);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0xf) = auVar3._0_8_;
  uVar2 = in[7];
  out[0x11] = uVar1 >> 0x1d;
  out[0x11] = uVar1 >> 0x1d | (uVar2 & 0x3ff) << 3;
  uVar1 = in[8];
  out[0x12] = uVar2 >> 10 & 0x1fff;
  out[0x13] = uVar2 >> 0x17;
  out[0x13] = uVar2 >> 0x17 | (uVar1 & 0xf) << 9;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6040);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x14) = auVar3._0_8_;
  out[0x16] = uVar1 >> 0x1e;
  uVar2 = in[9];
  out[0x16] = uVar1 >> 0x1e | (uVar2 & 0x7ff) << 2;
  out[0x17] = uVar2 >> 0xb & 0x1fff;
  out[0x18] = uVar2 >> 0x18;
  uVar1 = in[10];
  out[0x18] = uVar2 >> 0x18 | (uVar1 & 0x1f) << 8;
  auVar3 = vpbroadcastd_avx512vl();
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6050);
  auVar3 = vpand_avx(auVar3,auVar4);
  *(long *)(out + 0x19) = auVar3._0_8_;
  uVar2 = in[0xb];
  out[0x1b] = uVar1 >> 0x1f;
  out[0x1b] = uVar1 >> 0x1f | (uVar2 & 0xfff) << 1;
  uVar1 = in[0xc];
  out[0x1c] = uVar2 >> 0xc & 0x1fff;
  out[0x1d] = uVar2 >> 0x19;
  out[0x1d] = uVar2 >> 0x19 | (uVar1 & 0x3f) << 7;
  out[0x1e] = uVar1 >> 6 & 0x1fff;
  out[0x1f] = uVar1 >> 0x13;
  return in + 0xd;
}

Assistant:

const uint32_t *__fastunpack13_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 13);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 2)) << (13 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 13);
  out++;
  *out = ((*in) >> 15) % (1U << 13);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 9)) << (13 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 13);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 3)) << (13 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 13);
  out++;
  *out = ((*in) >> 16) % (1U << 13);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 10)) << (13 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 13);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 4)) << (13 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 13);
  out++;
  *out = ((*in) >> 17) % (1U << 13);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 11)) << (13 - 11);
  out++;
  *out = ((*in) >> 11) % (1U << 13);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 5)) << (13 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 13);
  out++;
  *out = ((*in) >> 18) % (1U << 13);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 12)) << (13 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 13);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 6)) << (13 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 13);
  out++;
  *out = ((*in) >> 19);
  ++in;
  out++;

  return in;
}